

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O0

void __thiscall
test::string_assertion_test::iu_StrCaseTest_x_iutest_x_EqRaw_Test<wchar_t>::Body
          (iu_StrCaseTest_x_iutest_x_EqRaw_Test<wchar_t> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_5d0;
  Fixed local_5a0;
  undefined1 local_418 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3c0;
  undefined1 local_238 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_208;
  Fixed local_1c8;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  TypeParam_conflict *p;
  iu_StrCaseTest_x_iutest_x_EqRaw_Test<wchar_t> *this_local;
  
  iutest_ar._32_8_ = text<wchar_t>::test;
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRCASEEQ
            ((AssertionResult *)local_40,"TestFixture::Text::test","p",
             (wchar_t *)text<wchar_t>::test,(wchar_t *)iutest_ar._32_8_);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1c8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xad,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1c8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1c8);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperSTRCASEEQ
              ((AssertionResult *)local_238,"TestFixture::Text::test","p",
               (wchar_t *)text<wchar_t>::test,(wchar_t *)iutest_ar._32_8_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      memset(&local_3c0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_238);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0xae,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3c0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperSTRCASEEQ
              ((AssertionResult *)local_418,"TestFixture::Text::test","p",
               (wchar_t *)text<wchar_t>::test,(wchar_t *)iutest_ar._32_8_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
    if (!bVar1) {
      memset(&local_5a0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5a0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_418);
      iutest::AssertionHelper::AssertionHelper
                (&local_5d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0xaf,pcVar2,kWarning);
      iutest::AssertionHelper::operator=(&local_5d0,&local_5a0);
      iutest::AssertionHelper::~AssertionHelper(&local_5d0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5a0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, EqRaw)
{
    const TypeParam* p = TestFixture::Text::test;
    IUTEST_ASSERT_STRCASEEQ(TestFixture::Text::test, p);
    IUTEST_EXPECT_STRCASEEQ(TestFixture::Text::test, p);
    IUTEST_INFORM_STRCASEEQ(TestFixture::Text::test, p);
}